

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

string * __thiscall CTxIn::ToString_abi_cxx11_(string *__return_storage_ptr__,CTxIn *this)

{
  uint uVar1;
  CScript *pCVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar4;
  string *this_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string sStack_78;
  string local_58;
  string local_38;
  long local_18;
  
  this_00 = &sStack_78;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"CTxIn(");
  COutPoint::ToString_abi_cxx11_(&local_38,&this->prevout);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar3 = COutPoint::IsNull(&this->prevout);
  if (bVar3) {
    uVar1 = (this->scriptSig).super_CScriptBase._size;
    uVar4 = uVar1 - 0x1d;
    pCVar2 = (CScript *)(this->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar4 = uVar1;
      pCVar2 = &this->scriptSig;
    }
    s.m_size._0_4_ = uVar4;
    s.m_data = (uchar *)pCVar2;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_58,s);
    tinyformat::format<std::__cxx11::string>
              (&local_38,(tinyformat *)", coinbase %s",(char *)&local_58,in_RCX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = &local_58;
  }
  else {
    uVar1 = (this->scriptSig).super_CScriptBase._size;
    uVar4 = uVar1 - 0x1d;
    pCVar2 = (CScript *)(this->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar4 = uVar1;
      pCVar2 = &this->scriptSig;
    }
    s_00.m_size._0_4_ = uVar4;
    s_00.m_data = (uchar *)pCVar2;
    s_00.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&sStack_78,s_00);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,&sStack_78,0,0x18);
    tinyformat::format<std::__cxx11::string>
              (&local_38,(tinyformat *)", scriptSig=%s",(char *)&local_58,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->nSequence != 0xffffffff) {
    tinyformat::format<unsigned_int>(&local_38,", nSequence=%u",&this->nSequence);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,")");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CTxIn::ToString() const
{
    std::string str;
    str += "CTxIn(";
    str += prevout.ToString();
    if (prevout.IsNull())
        str += strprintf(", coinbase %s", HexStr(scriptSig));
    else
        str += strprintf(", scriptSig=%s", HexStr(scriptSig).substr(0, 24));
    if (nSequence != SEQUENCE_FINAL)
        str += strprintf(", nSequence=%u", nSequence);
    str += ")";
    return str;
}